

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadPointLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  AffineSpace3fa *space_00;
  undefined8 in_RDX;
  Node *in_RDI;
  PointLight light;
  Vec3fa P;
  Vec3fa I;
  AffineSpace3fa space;
  Ref<embree::XML> *in_stack_00000760;
  XMLLoader *in_stack_00000768;
  Vec3fa *in_stack_fffffffffffffda0;
  PointLight *in_stack_fffffffffffffda8;
  LightNodeImpl<embree::SceneGraph::PointLight> *this_00;
  PointLight *this_01;
  Ref<embree::XML> *in_stack_fffffffffffffe18;
  XMLLoader *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_188;
  allocator local_171;
  string local_170 [32];
  long *local_150;
  undefined4 local_144;
  undefined1 local_140 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_130;
  allocator local_111;
  string local_110 [32];
  long *local_f0 [9];
  undefined8 local_a8;
  undefined8 local_90;
  undefined4 *local_80;
  undefined1 *local_78;
  long **local_70;
  PointLight *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_50;
  AffineSpace3fa *local_48;
  ulong uStack_30;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_a8 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"AffineSpace",&local_111);
  XML::child((XML *)in_stack_fffffffffffffe60,(string *)in_stack_fffffffffffffe58);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            (in_stack_00000768,in_stack_00000760);
  local_70 = local_f0;
  if (local_f0[0] != (long *)0x0) {
    (**(code **)(*local_f0[0] + 0x18))();
  }
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  local_90 = local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"I",&local_171);
  XML::child((XML *)in_stack_fffffffffffffe60,(string *)in_stack_fffffffffffffe58);
  load<embree::Vec3<float>>(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_78 = local_140 + 8;
  local_80 = &local_144;
  local_1c = 0;
  uStack_30 = (ulong)(uint)local_140._4_4_;
  local_140._8_4_ = local_144;
  local_140._12_4_ = local_140._0_4_;
  aStack_130.m128[0] = (float)local_140._4_4_;
  aStack_130.m128[1] = 0.0;
  this_01 = (PointLight *)&local_150;
  local_60 = this_01;
  if (local_150 != (long *)0x0) {
    (**(code **)(*local_150 + 0x18))();
  }
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  local_50 = &local_188;
  local_18 = 0;
  uStack_10 = 0;
  local_188._M_allocated_capacity = 0;
  local_188._8_8_ = 0;
  this_00 = (LightNodeImpl<embree::SceneGraph::PointLight> *)&stack0xfffffffffffffe38;
  SceneGraph::PointLight::PointLight
            ((PointLight *)this_00,(Vec3fa *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  space_00 = (AffineSpace3fa *)
             SceneGraph::LightNodeImpl<embree::SceneGraph::PointLight>::operator_new(0x37f0ae);
  SceneGraph::PointLight::transform(this_01,space_00);
  SceneGraph::LightNodeImpl<embree::SceneGraph::PointLight>::LightNodeImpl
            (this_00,in_stack_fffffffffffffda8);
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)space_00;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    local_48 = space_00;
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadPointLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa I = load<Vec3f>(xml->child("I"));
    const Vec3fa P = Vec3fa(zero);
    const SceneGraph::PointLight light = SceneGraph::PointLight(P,I);
    return new SceneGraph::LightNodeImpl<SceneGraph::PointLight>(light.transform(space));
  }